

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

shared_ptr<wallet::CWallet> __thiscall
wallet::GetWallet(wallet *this,WalletContext *context,string *name)

{
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __type_conflict _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> sVar4;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  unique_lock<std::mutex> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_40,&context->wallets_mutex,
             "context.wallets_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0xce,false);
  p_Var3 = &((context->wallets).
             super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  p_Var1 = &((context->wallets).
             super__Vector_base<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
  do {
    if (p_Var3 == p_Var1) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
LAB_0045eef6:
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<wallet::CWallet>)
               sVar4.super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
      }
      __stack_chk_fail();
    }
    _Var2 = std::operator==(&p_Var3->_M_ptr->m_name,name);
    if (_Var2) {
      _GLOBAL__N_1::std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var3);
      goto LAB_0045eef6;
    }
    p_Var3 = p_Var3 + 1;
  } while( true );
}

Assistant:

std::shared_ptr<CWallet> GetWallet(WalletContext& context, const std::string& name)
{
    LOCK(context.wallets_mutex);
    for (const std::shared_ptr<CWallet>& wallet : context.wallets) {
        if (wallet->GetName() == name) return wallet;
    }
    return nullptr;
}